

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xpath_position(lyxp_set **UNUSED_args,uint16_t UNUSED_arg_count,lyd_node *UNUSED_cur_node,
                  lys_module *UNUSED_local_mod,lyxp_set *set,int options)

{
  char *pcVar1;
  int options_local;
  lyxp_set *set_local;
  lys_module *UNUSED_local_mod_local;
  lyd_node *UNUSED_cur_node_local;
  uint16_t UNUSED_arg_count_local;
  lyxp_set **UNUSED_args_local;
  
  if (set->type == LYXP_SET_EMPTY) {
    set_fill_number(set,(longdouble)0);
    UNUSED_args_local._4_4_ = 0;
  }
  else if (set->type == LYXP_SET_NODE_SET) {
    set_fill_number(set,(longdouble)set->ctx_pos);
    UNUSED_args_local._4_4_ = 0;
  }
  else {
    pcVar1 = print_set_type(set);
    ly_vlog(LYE_XPATH_INCTX,LY_VLOG_NONE,(void *)0x0,pcVar1,"position()");
    UNUSED_args_local._4_4_ = -1;
  }
  return UNUSED_args_local._4_4_;
}

Assistant:

static int
xpath_position(struct lyxp_set **UNUSED(args), uint16_t UNUSED(arg_count), struct lyd_node *UNUSED(cur_node),
               struct lys_module *UNUSED(local_mod), struct lyxp_set *set, int options)
{
    if (set->type == LYXP_SET_EMPTY) {
        set_fill_number(set, 0);
        return EXIT_SUCCESS;
    }
    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(LYE_XPATH_INCTX, LY_VLOG_NONE, NULL, print_set_type(set), "position()");
        return -1;
    }

    set_fill_number(set, set->ctx_pos);

    /* UNUSED in 'Release' build type */
    (void)options;
    return EXIT_SUCCESS;
}